

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_comparison_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundComparisonExpression::Copy(BoundComparisonExpression *this)

{
  pointer pEVar1;
  BoundComparisonExpression *this_00;
  pointer this_01;
  Expression *in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> local_28;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 1));
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_38,pEVar1);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&in_RSI[1].super_BaseExpression.type);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_40,pEVar1);
  this_00 = (BoundComparisonExpression *)operator_new(0x68);
  local_20._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (Expression *)0x0;
  local_30._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (Expression *)0x0;
  BoundComparisonExpression
            (this_00,(in_RSI->super_BaseExpression).type,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_30);
  local_28._M_head_impl = this_00;
  if (local_30._M_head_impl != (Expression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_30._M_head_impl = (Expression *)0x0;
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_40._M_head_impl != (Expression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_38._M_head_impl != (Expression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  this_01 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                          *)&local_28);
  Expression::CopyProperties(&this_01->super_Expression,in_RSI);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundComparisonExpression::Copy() const {
	auto copy = make_uniq<BoundComparisonExpression>(type, left->Copy(), right->Copy());
	copy->CopyProperties(*this);
	return std::move(copy);
}